

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O3

void sptk::snack::get_fast_cands
               (float *fdata,float *fdsdata,int ind,int step,int size,int dec,int start,int nlags,
               float *engref,int *maxloc,float *maxval,Cross *cp,float *peaks,int *locs,int *ncand,
               F0_params *par,int *dbsize,float **dbdata)

{
  ulong *puVar1;
  float *correl;
  float fVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  fVar10 = par->lag_weight;
  iVar8 = nlags / dec + 1;
  uVar3 = 1;
  if (1 < start / dec) {
    uVar3 = start / dec;
  }
  correl = cp->correl;
  crossf(fdsdata + (ind * step) / dec,size / dec + 1,uVar3,iVar8,engref,maxloc,maxval,correl,dbsize,
         dbdata);
  cp->maxloc = (short)*maxloc;
  cp->maxval = *maxval;
  fVar9 = *engref / (float)size;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  cp->rms = fVar9;
  cp->firstlag = (short)uVar3;
  get_cand(cp,peaks,locs,iVar8,ncand,par->cand_thresh);
  iVar8 = *ncand;
  if (iVar8 == 0) {
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    do {
      lVar7 = (long)(int)(locs[lVar5] + ~uVar3);
      fVar9 = correl[lVar7 + 1];
      fVar12 = correl[lVar7] - correl[lVar7 + 2];
      fVar2 = fVar12 * 0.5 + (correl[lVar7 + 2] - fVar9);
      fVar11 = 0.0;
      if (1e-06 < ABS(fVar2)) {
        fVar11 = fVar12 / (fVar2 * 4.0);
        fVar9 = fVar9 - fVar2 * fVar11 * fVar11;
      }
      iVar6 = (int)(fVar11 * (float)dec + 0.5) + locs[lVar5] * dec;
      locs[lVar5] = iVar6;
      peaks[lVar5] = ((float)iVar6 * (-fVar10 / (float)nlags) + 1.0) * fVar9;
      lVar5 = lVar5 + 1;
    } while (iVar8 != (int)lVar5);
    uVar3 = *ncand;
  }
  iVar8 = par->n_cands;
  if (iVar8 <= (int)uVar3) {
    uVar3 = iVar8 - 1;
    if (1 < iVar8) {
      uVar4 = 0;
      do {
        if (~uVar4 + *ncand != 0) {
          lVar5 = (long)*ncand + -1;
          do {
            fVar10 = peaks[lVar5];
            if (peaks[lVar5 + -1] < fVar10) {
              peaks[lVar5] = peaks[lVar5 + -1];
              peaks[lVar5 + -1] = fVar10;
              puVar1 = (ulong *)(locs + lVar5 + -1);
              *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
            }
            lVar5 = lVar5 + -1;
          } while (uVar4 != (uint)lVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar3);
      uVar3 = par->n_cands - 1;
    }
    *ncand = uVar3;
  }
  crossfi(fdata + ind * step,size,start,nlags,7,engref,maxloc,maxval,correl,locs,uVar3,dbsize,dbdata
         );
  cp->maxloc = (short)*maxloc;
  cp->maxval = *maxval;
  fVar10 = *engref / (float)size;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  cp->rms = fVar10;
  cp->firstlag = (short)start;
  get_cand(cp,peaks,locs,nlags,ncand,par->cand_thresh);
  iVar8 = par->n_cands;
  if (iVar8 <= *ncand) {
    uVar3 = iVar8 - 1;
    if (1 < iVar8) {
      uVar4 = 0;
      do {
        if (~uVar4 + *ncand != 0) {
          lVar5 = (long)*ncand + -1;
          do {
            fVar10 = peaks[lVar5];
            if (peaks[lVar5 + -1] < fVar10) {
              peaks[lVar5] = peaks[lVar5 + -1];
              peaks[lVar5 + -1] = fVar10;
              puVar1 = (ulong *)(locs + lVar5 + -1);
              *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
            }
            lVar5 = lVar5 + -1;
          } while (uVar4 != (uint)lVar5);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar3);
      uVar3 = par->n_cands - 1;
    }
    *ncand = uVar3;
  }
  return;
}

Assistant:

void get_fast_cands(float *fdata, float *fdsdata, int ind, int step, int size,
                    int dec, int start, int nlags, float *engref, int *maxloc,
                    float *maxval, Cross *cp, float *peaks, int *locs,
                    int *ncand, F0_params *par, int *dbsize, float **dbdata)
#endif
{
  int decind, decstart, decnlags, decsize, i, j, *lp;
  float *corp, xp, yp, lag_wt;
  register float *pe;

  lag_wt = par->lag_weight/nlags;
  decnlags = 1 + (nlags/dec);
  if((decstart = start/dec) < 1) decstart = 1;
  decind = (ind * step)/dec;
  decsize = 1 + (size/dec);
  corp = cp->correl;
    
  crossf(fdsdata + decind, decsize, decstart, decnlags, engref, maxloc,
#if 0
	maxval, corp);
#else
	maxval, corp, dbsize, dbdata);
#endif
  cp->maxloc = *maxloc;	/* location of maximum in correlation */
  cp->maxval = *maxval;	/* max. correlation value (found at maxloc) */
  cp->rms = (float) sqrt(*engref/size); /* rms in reference window */
  cp->firstlag = decstart;

  get_cand(cp,peaks,locs,decnlags,ncand,par->cand_thresh); /* return high peaks in xcorr */

  /* Interpolate to estimate peak locations and values at high sample rate. */
  for(i = *ncand, lp = locs, pe = peaks; i--; pe++, lp++) {
    j = *lp - decstart - 1;
    peak(&corp[j],&xp,&yp);
    *lp = (*lp * dec) + (int)(0.5+(xp*dec)); /* refined lag */
    *pe = yp*(1.0f - (lag_wt* *lp)); /* refined amplitude */
  }
  
  if(*ncand >= par->n_cands) {	/* need to prune candidates? */
    register int *loc, *locm, lt;
    register float smaxval, *pem;
    register int outer, inner, lim;
    for(outer=0, lim = par->n_cands-1; outer < lim; outer++)
      for(inner = *ncand - 1 - outer,
	  pe = peaks + (*ncand) -1, pem = pe-1,
	  loc = locs + (*ncand) - 1, locm = loc-1;
	  inner--;
	  pe--,pem--,loc--,locm--)
	if((smaxval = *pe) > *pem) {
	  *pe = *pem;
	  *pem = smaxval;
	  lt = *loc;
	  *loc = *locm;
	  *locm = lt;
	}
    *ncand = par->n_cands-1;  /* leave room for the unvoiced hypothesis */
  }
  crossfi(fdata + (ind * step), size, start, nlags, 7, engref, maxloc,
#if 0
	  maxval, corp, locs, *ncand);
#else
	  maxval, corp, locs, *ncand, dbsize, dbdata);
#endif

  cp->maxloc = *maxloc;	/* location of maximum in correlation */
  cp->maxval = *maxval;	/* max. correlation value (found at maxloc) */
  cp->rms = (float) sqrt(*engref/size); /* rms in reference window */
  cp->firstlag = start;
  get_cand(cp,peaks,locs,nlags,ncand,par->cand_thresh); /* return high peaks in xcorr */
    if(*ncand >= par->n_cands) {	/* need to prune candidates again? */
    register int *loc, *locm, lt;
    register float smaxval, *pe, *pem;
    register int outer, inner, lim;
    for(outer=0, lim = par->n_cands-1; outer < lim; outer++)
      for(inner = *ncand - 1 - outer,
	  pe = peaks + (*ncand) -1, pem = pe-1,
	  loc = locs + (*ncand) - 1, locm = loc-1;
	  inner--;
	  pe--,pem--,loc--,locm--)
	if((smaxval = *pe) > *pem) {
	  *pe = *pem;
	  *pem = smaxval;
	  lt = *loc;
	  *loc = *locm;
	  *locm = lt;
	}
    *ncand = par->n_cands - 1;  /* leave room for the unvoiced hypothesis */
  }
}